

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

void __thiscall kj::_::BTreeImpl::free(BTreeImpl *this,void *__ptr)

{
  undefined8 *puVar1;
  NodeUnion *pNVar2;
  ulong uVar3;
  
  pNVar2 = this->tree;
  uVar3 = (ulong)__ptr & 0xffffffff;
  pNVar2[uVar3].field_0.leaf.next = ~(uint)__ptr + this->freelistHead;
  puVar1 = (undefined8 *)((long)&pNVar2[uVar3].field_0 + 4);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)&pNVar2[uVar3].field_0 + 0x14);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)&pNVar2[uVar3].field_0 + 0x24);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)&pNVar2[uVar3].field_0 + 0x30);
  *puVar1 = 0;
  puVar1[1] = 0;
  this->freelistHead = (uint)__ptr;
  this->freelistSize = this->freelistSize + 1;
  return;
}

Assistant:

inline void BTreeImpl::free(uint pos) {
  // Add the given node to the freelist.

  // HACK: This is typically called on a node immediately after copying its contents away, but the
  //   pointer used to copy it away may be a different pointer pointing to a different union member
  //   which the compiler may not recgonize as aliasing with this object. Just to be extra-safe,
  //   insert a compiler barrier.
  compilerBarrier();

  auto& node = tree[pos];
  node.freelist.nextOffset = freelistHead - pos - 1;
  azero(node.freelist.zero, kj::size(node.freelist.zero));
  freelistHead = pos;
  ++freelistSize;
}